

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSphereShape.cpp
# Opt level: O2

void __thiscall chrono::ChSphereShape::ArchiveIN(ChSphereShape *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::geometry::ChSphere> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChSphereShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_28._value = &this->gsphere;
  local_28._name = "gsphere";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChSphereShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSphereShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gsphere);
}